

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::RecordReadSample(DBImpl *this,Slice key)

{
  bool bVar1;
  Version *this_00;
  MutexLock local_28;
  MutexLock l;
  DBImpl *this_local;
  Slice key_local;
  
  l.mu_ = (Mutex *)this;
  MutexLock::MutexLock(&local_28,&this->mutex_);
  this_00 = VersionSet::current(this->versions_);
  bVar1 = Version::RecordReadSample(this_00,key);
  if (bVar1) {
    MaybeScheduleCompaction(this);
  }
  MutexLock::~MutexLock(&local_28);
  return;
}

Assistant:

void DBImpl::RecordReadSample(Slice key) {
  MutexLock l(&mutex_);
  if (versions_->current()->RecordReadSample(key)) {
    MaybeScheduleCompaction();
  }
}